

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O3

void dump_attr_sublist(FILE *out,attr_list list,int indent)

{
  uint uVar1;
  atom_t atom;
  ushort *puVar2;
  attr_p paVar3;
  char *pcVar4;
  ushort **ppuVar5;
  int_attr_struct *piVar6;
  char *__ptr;
  char *pcVar7;
  double dVar8;
  ulong uVar9;
  int iVar10;
  char *pcVar11;
  long lVar12;
  uchar c [30];
  
  if ((global_as == (atom_server)0x0) &&
     (global_as = init_atom_server(prefill_atom_cache), init_global_atom_server_first == '\0')) {
    init_global_atom_server_first = '\x01';
  }
  if (dump_attr_sublist::IP_ADDR == -1) {
    dump_attr_sublist::CM_ENET_ADDR = attr_atom_from_string("CM_ENET_ADDR");
    dump_attr_sublist::IP_ADDR = attr_atom_from_string("IP_ADDR");
    dump_attr_sublist::NNTI_ADDR = attr_atom_from_string("NNTI_ADDR");
    dump_attr_sublist::PEER_IP = attr_atom_from_string("PEER_IP");
  }
  if (list == (attr_list)0x0) {
    fwrite("[NULL]\n",7,1,(FILE *)out);
    return;
  }
  piVar6 = (list->l).list.iattrs;
  if (piVar6->int_attr_count != '\0') {
    uVar9 = 0;
    do {
      uVar1 = piVar6->iattr[uVar9].attr_id;
      pcVar4 = string_from_atom(global_as,uVar1);
      pcVar11 = pcVar4;
      if (pcVar4 == (char *)0x0) {
        pcVar11 = "<null attr name>";
      }
      c[4] = '\0';
      c._0_4_ = uVar1;
      iVar10 = indent;
      if (0 < indent) {
        do {
          fwrite("    ",4,1,(FILE *)out);
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      if ((((uVar1 == dump_attr_sublist::CM_ENET_ADDR) || (uVar1 == dump_attr_sublist::IP_ADDR)) ||
          (uVar1 == dump_attr_sublist::NNTI_ADDR)) || (uVar1 == dump_attr_sublist::PEER_IP)) {
        uVar1 = ((list->l).list.iattrs)->iattr[uVar9].value;
        fprintf((FILE *)out,"    { %s (\'%c%c%c%c\'), Attr_Int4, %d.%d.%d.%d }\n",pcVar11,
                (ulong)c[0],(ulong)c[1],(ulong)c[2],(ulong)c[3],(ulong)(uVar1 >> 0x18),
                (ulong)(uVar1 >> 0x10 & 0xff),(ulong)(uVar1 >> 8 & 0xff),(ulong)(uVar1 & 0xff));
      }
      else {
        ppuVar5 = __ctype_b_loc();
        puVar2 = *ppuVar5;
        if ((((*(byte *)((long)puVar2 + (ulong)c[0] * 2 + 1) & 0x40) == 0) ||
            ((*(byte *)((long)puVar2 + (ulong)c[1] * 2 + 1) & 0x40) == 0)) ||
           (((*(byte *)((long)puVar2 + (ulong)c[2] * 2 + 1) & 0x40) == 0 ||
            ((*(byte *)((long)puVar2 + (ulong)c[3] * 2 + 1) & 0x40) == 0)))) {
          sprintf((char *)c,"0x%x",(ulong)uVar1);
        }
        fprintf((FILE *)out,"    { %s (\'%s\'), Attr_Int4, %ld }\n",pcVar11,c,
                (long)((list->l).list.iattrs)->iattr[uVar9].value);
      }
      if (pcVar4 != (char *)0x0) {
        free(pcVar4);
      }
      uVar9 = uVar9 + 1;
      piVar6 = (list->l).list.iattrs;
    } while (uVar9 < piVar6->int_attr_count);
  }
  if (piVar6->other_attr_count != '\0') {
    uVar9 = 0;
    do {
      uVar1 = (list->l).list.attributes[uVar9].attr_id;
      pcVar11 = string_from_atom(global_as,uVar1);
      c[4] = '\0';
      c._0_4_ = uVar1;
      ppuVar5 = __ctype_b_loc();
      puVar2 = *ppuVar5;
      if ((((*(byte *)((long)puVar2 + (ulong)(uVar1 & 0xff) * 2 + 1) & 0x40) == 0) ||
          ((*(byte *)((long)puVar2 + (ulong)(uVar1 >> 8 & 0xff) * 2 + 1) & 0x40) == 0)) ||
         (((*(byte *)((long)puVar2 + (ulong)(uVar1 >> 0x10 & 0xff) * 2 + 1) & 0x40) == 0 ||
          ((*(byte *)((long)puVar2 + (ulong)(uVar1 >> 0x18) * 2 + 1) & 0x40) == 0)))) {
        sprintf((char *)c,"0x%x",(ulong)uVar1);
      }
      pcVar4 = pcVar11;
      if (pcVar11 == (char *)0x0) {
        pcVar4 = "<null attr name>";
      }
      iVar10 = indent;
      if (0 < indent) {
        do {
          printf("    ");
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      paVar3 = (list->l).list.attributes;
      switch(paVar3[uVar9].val_type) {
      case Attr_Undefined:
        pcVar7 = "    { %s (\'%s\'), Undefined, Undefined }\n";
        goto LAB_001065a4;
      case Attr_Int4:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                      ,0x3ca,"void dump_attr_sublist(FILE *, attr_list, int)");
      case Attr_Int8:
        dVar8 = paVar3[uVar9].value.u.d;
        pcVar7 = "    { %s (\'%s\'), Attr_Int8, %ld }\n";
LAB_0010651f:
        printf(pcVar7,pcVar4,c,dVar8);
        break;
      case Attr_String:
        dVar8 = (double)paVar3[uVar9].value.u.l;
        if (dVar8 != 0.0) {
          pcVar7 = "    { %s (\'%s\'), Attr_String, %s }\n";
          goto LAB_0010651f;
        }
        pcVar7 = "    { %s (\'%s\'), Attr_String, NULL }\n";
        goto LAB_001065a4;
      case Attr_Opaque:
        if (paVar3[uVar9].value.u.l != 0) {
          printf("    { %s (\'%s\'), Attr_Opaque, \"",pcVar4,c);
          if (0 < paVar3[uVar9].value.u.i) {
            lVar12 = 0;
            do {
              putchar((int)*(char *)((long)paVar3[uVar9].value.u.o.buffer + lVar12));
              lVar12 = lVar12 + 1;
            } while (lVar12 < paVar3[uVar9].value.u.i);
          }
          printf("\"\n            <");
          if (0 < paVar3[uVar9].value.u.i) {
            lVar12 = 0;
            do {
              printf(" %02x",(ulong)*(byte *)((long)paVar3[uVar9].value.u.o.buffer + lVar12));
              lVar12 = lVar12 + 1;
            } while (lVar12 < paVar3[uVar9].value.u.i);
          }
          pcVar4 = ">}";
          goto LAB_0010658d;
        }
        pcVar7 = "    { %s (\'%s\'), Attr_Opaque, NULL }\n";
LAB_001065a4:
        printf(pcVar7,pcVar4,c);
        break;
      case Attr_Atom:
        atom = paVar3[uVar9].value.u.i;
        __ptr = string_from_atom(global_as,atom);
        pcVar7 = __ptr;
        if (__ptr == (char *)0x0) {
          pcVar7 = "<null attr name>";
        }
        printf("    { %s (\'%s\'), Attr_Atom, %s (\'%c%c%c%c\') }\n",pcVar4,c,pcVar7,
               (ulong)(uint)(int)(char)atom,(ulong)(uint)(int)(char)((uint)atom >> 8),
               (ulong)(uint)(int)(char)((uint)atom >> 0x10),(ulong)(uint)(atom >> 0x18));
        if (__ptr != (char *)0x0) {
          free(__ptr);
        }
        break;
      case Attr_List:
        printf("    { %s (\'%s\'), Attr_List, ->\n",pcVar4,c);
        internal_dump_attr_list
                  (out,(attr_list)(list->l).list.attributes[uVar9].value.u.p,indent + 1);
        iVar10 = indent;
        if (0 < indent) {
          do {
            printf("    ");
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
        }
        pcVar4 = " }";
LAB_0010658d:
        puts(pcVar4);
        break;
      case Attr_Float16:
      case Attr_Float8:
      case Attr_Float4:
        printf("    { %s (\'%s\'), Attr_Float8, %g }\n",paVar3[uVar9].value.u.d,pcVar4,c);
      }
      if (pcVar11 != (char *)0x0) {
        free(pcVar11);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < ((list->l).list.iattrs)->other_attr_count);
  }
  return;
}

Assistant:

static void
dump_attr_sublist(FILE *out, attr_list list, int indent)
{
    int i;
    static atom_t CM_ENET_ADDR = -1;
    static atom_t IP_ADDR = -1;
    static atom_t NNTI_ADDR = -1;
    static atom_t PEER_IP = -1;
    init_global_atom_server(&global_as);
    if (IP_ADDR == -1) {
	CM_ENET_ADDR = attr_atom_from_string("CM_ENET_ADDR");
	IP_ADDR  = attr_atom_from_string("IP_ADDR");
	NNTI_ADDR = attr_atom_from_string("NNTI_ADDR");
	PEER_IP = attr_atom_from_string("PEER_IP");
    }
    if (list == NULL) {
        fprintf(out, "[NULL]\n");
        return;
    }
    for (i = 0; i < list->l.list.iattrs->int_attr_count; i++) {
	int attr_id = list->l.list.iattrs->iattr[i].attr_id;
	unsigned char c[30];
        char *attr_name = string_from_atom(global_as, attr_id), *print_name;
        int j;
	memcpy(&c[0], &attr_id, 4);
	c[4] = 0;
	print_name = attr_name;
        if (attr_name == NULL)
            print_name = "<null attr name>";
        for (j = 0; j < indent; j++) {
            fprintf(out, "    ");
        }
	if ((attr_id == CM_ENET_ADDR) || (attr_id == IP_ADDR) ||
	     (attr_id == NNTI_ADDR) || (attr_id == PEER_IP)) {
	    /* built-in's we want to format differently */
	    unsigned int ip = list->l.list.iattrs->iattr[i].value;
	    fprintf(out, "    { %s ('%c%c%c%c'), Attr_Int4, %d.%d.%d.%d }\n", print_name,
		   c[0], c[1], c[2], c[3],
		   ((ip & 0xff000000) >> 24), ((ip & 0x00ff0000) >> 16), 
		   ((ip & 0x0000ff00) >> 8), (ip & 0x000000ff));
	} else {
	    char *print_id = (char*) &c[0];
	    if ((!isprint((int)c[0])) || (!isprint((int)c[1])) || (!isprint((int)c[2])) || 
		(!isprint((int)c[3]))) {
		sprintf(print_id, "0x%x", attr_id);
	    }
	    fprintf(out, "    { %s ('%s'), Attr_Int4, %ld }\n", print_name,
		   print_id, (long) list->l.list.iattrs->iattr[i].value);
	}
	if (attr_name) free(attr_name);
    }
	
    for (i = 0; i < list->l.list.iattrs->other_attr_count; i++) {
	int attr_id = list->l.list.attributes[i].attr_id;
	unsigned char c[15];
	char *attr_name = string_from_atom(global_as, attr_id);
        char *print_name;
        int j;
	char *print_id = (char*)&c[0];
	print_name = attr_name;
	memcpy(&c[0], &attr_id, 4);
	c[4] = 0;
	if (!isprint((int)c[0]) || !isprint((int)c[1]) || !isprint((int)c[2]) || !isprint((int)c[3])) {
	    sprintf(print_id, "0x%x", attr_id);
	}
        if (attr_name == NULL)
            print_name = "<null attr name>";
        for (j = 0; j < indent; j++) {
            printf("    ");
        }
        switch (list->l.list.attributes[i].val_type) {
        case Attr_Undefined:
            printf("    { %s ('%s'), Undefined, Undefined }\n", 
		   print_name, print_id);
            break;
        case Attr_Int4:
	    assert(0);
            break;
        case Attr_Int8:
            printf("    { %s ('%s'), Attr_Int8, %ld }\n", print_name,
		   print_id,
                   (long) list->l.list.attributes[i].value.u.l);
            break;
        case Attr_Float16:
            printf("    { %s ('%s'), Attr_Float8, %g }\n", print_name,
		   print_id,
                   list->l.list.attributes[i].value.u.d);
            break;
        case Attr_Float8:
            printf("    { %s ('%s'), Attr_Float8, %g }\n", print_name,
		   print_id,
                   list->l.list.attributes[i].value.u.d);
            break;
        case Attr_Float4:
            printf("    { %s ('%s'), Attr_Float8, %g }\n", print_name,
		   print_id,
                   list->l.list.attributes[i].value.u.d);
            break;
        case Attr_String:
            if (((char*)list->l.list.attributes[i].value.u.p) != NULL) {
                printf("    { %s ('%s'), Attr_String, %s }\n", 
		       print_name, print_id,
                       (char *) list->l.list.attributes[i].value.u.p);
            } else {
                printf("    { %s ('%s'), Attr_String, NULL }\n", 
		       print_name, print_id);
            }
            break;          
        case Attr_Opaque:
            if (((char*)list->l.list.attributes[i].value.u.p) != NULL) {
                int j;
                attr_opaque_p o =
                    (attr_opaque_p) &list->l.list.attributes[i].value.u.o;
                printf("    { %s ('%s'), Attr_Opaque, \"", 
		       print_name, print_id);
                for (j=0; j< o->length; j++) {
                    printf("%c", ((char*)o->buffer)[j]);
                }
                printf("\"\n            <");
                for (j=0; j< o->length; j++) {
                    printf(" %02x", ((unsigned char*)o->buffer)[j]);
                }
                printf(">}\n");
            } else {
                printf("    { %s ('%s'), Attr_Opaque, NULL }\n", 
		       print_name, print_id);
            }
            break;
        case Attr_Atom: {
	    int atom_val = (atom_t)(long)list->l.list.attributes[i].value.u.i;
	    char *cv = (char*)&atom_val;
	    char *atom_str, *print_str;
            print_str = atom_str = string_from_atom(global_as, atom_val);
	    if (atom_str == NULL)
		print_str = "<null attr name>";
            printf("    { %s ('%s'), Attr_Atom, %s ('%c%c%c%c') }\n", 
		   print_name, print_id,
                   (char *) print_str, cv[0], cv[1], cv[2], cv[3]);
	    if (atom_str) free(atom_str);
            break;
	}
        case Attr_List:
            printf("    { %s ('%s'), Attr_List, ->\n", print_name,
		   print_id);
            internal_dump_attr_list(out, (attr_list) list->l.list.attributes[i].value.u.p,
                                    indent+1);
            for (j = 0; j< indent; j++) {
                printf("    ");
            }
            printf(" }\n");
            break;
        }
        if (attr_name) free(attr_name);
    }
}